

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O1

void __thiscall duckdb::JoinHashTable::ProbeSpill::PrepareNextProbe(ProbeSpill *this)

{
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  *this_00;
  pointer puVar1;
  pointer puVar2;
  pointer __p;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *__x;
  _Tuple_impl<0UL,_duckdb::ColumnDataConsumer_*,_std::default_delete<duckdb::ColumnDataConsumer>_>
  __ptr;
  pointer this_01;
  vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
  *this_02;
  idx_t iVar3;
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  *this_03;
  pointer pCVar4;
  type pCVar5;
  BufferManager *buffer_manager;
  ColumnDataCollection *this_04;
  _Head_base<0UL,_duckdb::ColumnDataConsumer_*,_false> _Var6;
  pointer this_05;
  ulong __n;
  _Head_base<0UL,_duckdb::ColumnDataConsumer_*,_false> local_50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  this_00 = &this->global_spill_collection;
  ::std::
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           *)this_00,(pointer)0x0);
  this_01 = unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>
            ::operator->(&this->global_partitions);
  this_02 = PartitionedColumnData::GetPartitions(this_01);
  puVar1 = (this_02->
           super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this_02->
           super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((puVar1 == puVar2) ||
     (iVar3 = TemplatedValidityMask<unsigned_long>::CountValid
                        (&(this->ht->current_partitions).super_TemplatedValidityMask<unsigned_long>,
                         (long)puVar2 - (long)puVar1 >> 3), iVar3 == 0)) {
    buffer_manager = BufferManager::GetBufferManager(this->context);
    __x = &this->probe_types->
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
    this_04 = (ColumnDataCollection *)operator_new(0x70);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector(&local_48,__x);
    ColumnDataCollection::ColumnDataCollection
              (this_04,buffer_manager,(vector<duckdb::LogicalType,_true> *)&local_48);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
    ::std::
    __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
    ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
             *)this_00,this_04);
  }
  else if ((this_02->
           super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           (this_02->
           super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      if (((this->ht->current_partitions).super_TemplatedValidityMask<unsigned_long>.validity_mask
           [__n >> 6] >> (__n & 0x3f) & 1) != 0) {
        this_03 = (__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                   *)vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
                     ::operator[](this_02,__n);
        if ((this_00->
            super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
            .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl ==
            (ColumnDataCollection *)0x0) {
          __p = (this_03->_M_t).
                super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
                .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl;
          (this_03->_M_t).
          super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
          .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
               (ColumnDataCollection *)0x0;
          ::std::
          __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
          ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                   *)this_00,__p);
        }
        else {
          pCVar4 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                   ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                                 *)this_03);
          if (pCVar4->count != 0) {
            pCVar4 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                     ::operator->(this_00);
            pCVar5 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                     ::operator*((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                                  *)this_03);
            ColumnDataCollection::Combine(pCVar4,pCVar5);
          }
        }
        ::std::
        __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
        ::reset(this_03,(pointer)0x0);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(this_02->
                                 super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_02->
                                 super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pCVar5 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
           ::operator*(this_00);
  _Var6._M_head_impl = (ColumnDataConsumer *)operator_new(0xb0);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
             &(this->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  ColumnDataConsumer::ColumnDataConsumer
            (_Var6._M_head_impl,pCVar5,(vector<unsigned_long,_true> *)&local_48);
  local_50._M_head_impl = _Var6._M_head_impl;
  if (local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  _Var6._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (ColumnDataConsumer *)0x0;
  __ptr.super__Head_base<0UL,_duckdb::ColumnDataConsumer_*,_false>._M_head_impl =
       (this->consumer).
       super_unique_ptr<duckdb::ColumnDataConsumer,_std::default_delete<duckdb::ColumnDataConsumer>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnDataConsumer,_std::default_delete<duckdb::ColumnDataConsumer>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnDataConsumer_*,_std::default_delete<duckdb::ColumnDataConsumer>_>
       .super__Head_base<0UL,_duckdb::ColumnDataConsumer_*,_false>;
  (this->consumer).
  super_unique_ptr<duckdb::ColumnDataConsumer,_std::default_delete<duckdb::ColumnDataConsumer>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ColumnDataConsumer,_std::default_delete<duckdb::ColumnDataConsumer>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnDataConsumer_*,_std::default_delete<duckdb::ColumnDataConsumer>_>
  .super__Head_base<0UL,_duckdb::ColumnDataConsumer_*,_false> =
       (_Head_base<0UL,_duckdb::ColumnDataConsumer_*,_false>)_Var6._M_head_impl;
  if (__ptr.super__Head_base<0UL,_duckdb::ColumnDataConsumer_*,_false>._M_head_impl !=
      (ColumnDataConsumer *)0x0) {
    ::std::default_delete<duckdb::ColumnDataConsumer>::operator()
              ((default_delete<duckdb::ColumnDataConsumer> *)this,
               (ColumnDataConsumer *)
               __ptr.super__Head_base<0UL,_duckdb::ColumnDataConsumer_*,_false>._M_head_impl);
  }
  if (local_50._M_head_impl != (ColumnDataConsumer *)0x0) {
    ::std::default_delete<duckdb::ColumnDataConsumer>::operator()
              ((default_delete<duckdb::ColumnDataConsumer> *)&local_50,local_50._M_head_impl);
  }
  this_05 = unique_ptr<duckdb::ColumnDataConsumer,_std::default_delete<duckdb::ColumnDataConsumer>,_true>
            ::operator->(&this->consumer);
  ColumnDataConsumer::InitializeScan(this_05);
  return;
}

Assistant:

void ProbeSpill::PrepareNextProbe() {
	global_spill_collection.reset();
	auto &partitions = global_partitions->GetPartitions();
	if (partitions.empty() || ht.current_partitions.CheckAllInvalid(partitions.size())) {
		// Can't probe, just make an empty one
		global_spill_collection =
		    make_uniq<ColumnDataCollection>(BufferManager::GetBufferManager(context), probe_types);
	} else {
		// Move current partitions to the global spill collection
		for (idx_t partition_idx = 0; partition_idx < partitions.size(); partition_idx++) {
			if (!ht.current_partitions.RowIsValidUnsafe(partition_idx)) {
				continue;
			}
			auto &partition = partitions[partition_idx];
			if (!global_spill_collection) {
				global_spill_collection = std::move(partition);
			} else if (partition->Count() != 0) {
				global_spill_collection->Combine(*partition);
			}
			partition.reset();
		}
	}
	consumer = make_uniq<ColumnDataConsumer>(*global_spill_collection, column_ids);
	consumer->InitializeScan();
}